

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManSolve(Cbs2_Man_t *p,int iLit)

{
  int iVar1;
  int local_18;
  int RetValue;
  int iLit_local;
  Cbs2_Man_t *p_local;
  
  local_18 = 0;
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x570,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x571,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
  }
  if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x572,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
  }
  (p->Pars).nBTThisNc = 0;
  (p->Pars).nJustThis = 0;
  (p->Pars).nBTThis = 0;
  Cbs2_ManAssign(p,iLit,0,0,0);
  iVar1 = Cbs2_ManSolve_rec(p,0);
  if (iVar1 == 0) {
    iVar1 = Cbs2_ManCheckLimits(p);
    if (iVar1 == 0) {
      Cbs2_ManSaveModel(p,p->vModel);
      goto LAB_0092cb76;
    }
  }
  local_18 = 1;
LAB_0092cb76:
  Cbs2_ManCancelUntil(p,0);
  Cbs2_ManCleanWatch(p);
  Cbs2_ManBumpClean(p);
  (p->pJust).iTail = 0;
  (p->pJust).iHead = 0;
  (p->pClauses).iTail = 1;
  (p->pClauses).iHead = 1;
  (p->Pars).nBTTotal = (p->Pars).nBTThis + (p->Pars).nBTTotal;
  iVar1 = Abc_MaxInt((p->Pars).nJustTotal,(p->Pars).nJustThis);
  (p->Pars).nJustTotal = iVar1;
  iVar1 = Cbs2_ManCheckLimits(p);
  if (iVar1 != 0) {
    local_18 = -1;
  }
  return local_18;
}

Assistant:

int Cbs2_ManSolve( Cbs2_Man_t * p, int iLit )
{
    int RetValue = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs2_ManAssign( p, iLit, 0, 0, 0 );
    if ( !Cbs2_ManSolve_rec(p, 0) && !Cbs2_ManCheckLimits(p) )
        Cbs2_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Cbs2_ManCancelUntil( p, 0 );
    Cbs2_ManCleanWatch( p );
    Cbs2_ManBumpClean( p );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs2_ManCheckLimits( p ) )
        RetValue = -1;
    return RetValue;
}